

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall NoiseSource::proceedToNextState(NoiseSource *this)

{
  int local_24;
  double dStack_20;
  int n;
  double omega;
  int i;
  NoiseSource *this_local;
  
  (this->super_StochasticProcess).stochNextStateIsPrepared = false;
  for (omega._4_4_ = 0; omega._4_4_ < this->nNoises; omega._4_4_ = omega._4_4_ + 1) {
    if (this->aNoises[omega._4_4_] != (Noise *)0x0) {
      dStack_20 = 0.0;
      for (local_24 = 0; local_24 < this->nNoises; local_24 = local_24 + 1) {
        dStack_20 = this->aA[omega._4_4_][local_24] * this->aOmega[local_24] + dStack_20;
      }
      (*(this->aNoises[omega._4_4_]->super_StochasticVariable).super_StochasticProcess.
        super_Parametric._vptr_Parametric[0xf])(dStack_20);
    }
  }
  (this->super_StochasticProcess).stochNextStateIsPrepared = false;
  return;
}

Assistant:

void NoiseSource::proceedToNextState()
{
	stochNextStateIsPrepared = false;
	for(int i=0; i<nNoises; ++i) {
		if(aNoises[i]) {
			double omega = 0.0;
			
			// sum up next value
			for(int n=0; n<nNoises; ++n)
				omega += aA[i][n] * aOmega[n];
			
			// notify noise process
			aNoises[i]->setNext(omega);
		}
	}
	stochNextStateIsPrepared = false;
}